

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  int iVar1;
  Vdbe *v;
  int iVar2;
  long lVar3;
  
  v = pParse->pVdbe;
  iVar2 = (uint)pParse->nColCache * 0x14;
  lVar3 = 0;
  while( true ) {
    if (iVar2 == (int)lVar3) {
      sqlite3ExprCodeGetColumnOfTable(v,pTab,iTable,iColumn,iReg);
      if (p5 == '\0') {
        sqlite3ExprCacheStore(pParse,iTable,iColumn,iReg);
      }
      else if (0 < (long)v->nOp) {
        v->aOp[(long)v->nOp + -1].p5 = (ushort)p5;
      }
      return iReg;
    }
    if ((*(int *)((long)&pParse->aColCache[0].iTable + lVar3) == iTable) &&
       (*(short *)((long)&pParse->aColCache[0].iColumn + lVar3) == iColumn)) break;
    lVar3 = lVar3 + 0x14;
  }
  iVar1 = pParse->iCacheCnt;
  pParse->iCacheCnt = iVar1 + 1;
  *(int *)((long)&pParse->aColCache[0].lru + lVar3) = iVar1;
  iVar1 = *(int *)((long)&pParse->aColCache[0].iReg + lVar3);
  for (lVar3 = 0; iVar2 - (int)lVar3 != 0; lVar3 = lVar3 + 0x14) {
    if (*(int *)((long)&pParse->aColCache[0].iReg + lVar3) == iVar1) {
      (&pParse->aColCache[0].tempReg)[lVar3] = '\0';
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column + FLAGS */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct yColCache *p;

  for(i=0, p=pParse->aColCache; i<pParse->nColCache; i++, p++){
    if( p->iTable==iTable && p->iColumn==iColumn ){
      p->lru = pParse->iCacheCnt++;
      sqlite3ExprCachePinRegister(pParse, p->iReg);
      return p->iReg;
    }
  }  
  assert( v!=0 );
  sqlite3ExprCodeGetColumnOfTable(v, pTab, iTable, iColumn, iReg);
  if( p5 ){
    sqlite3VdbeChangeP5(v, p5);
  }else{   
    sqlite3ExprCacheStore(pParse, iTable, iColumn, iReg);
  }
  return iReg;
}